

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayleigh_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::rayleigh_dist<float>::icdf(rayleigh_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar2;
  float fVar3;
  double dVar4;
  undefined4 local_4;
  
  if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_4 = std::numeric_limits<float>::quiet_NaN();
  }
  else {
    rVar2 = param_type::nu(in_RDI);
    fVar3 = math::ln(0.0);
    dVar4 = std::sqrt((double)(ulong)(uint)(fVar3 * -2.0));
    local_4 = rVar2 * SUB84(dVar4,0);
  }
  return local_4;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return P.nu() * math::sqrt(-2 * math::ln(1 - x));
    }